

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp.c
# Opt level: O0

void tcptran_pipe_stop(void *arg)

{
  nni_mtx *mtx;
  tcptran_ep *ep;
  tcptran_pipe *p;
  void *arg_local;
  
  mtx = *(nni_mtx **)((long)arg + 0x38);
  nni_aio_stop((nni_aio *)((long)arg + 0x268));
  nni_aio_stop((nni_aio *)((long)arg + 0xa0));
  nni_aio_stop((nni_aio *)((long)arg + 0x430));
  nng_stream_stop(*arg);
  nni_mtx_lock(mtx);
  nni_list_node_remove((nni_list_node *)((long)arg + 0x28));
  nni_mtx_unlock(mtx);
  return;
}

Assistant:

static void
tcptran_pipe_stop(void *arg)
{
	tcptran_pipe *p  = arg;
	tcptran_ep   *ep = p->ep;

	nni_aio_stop(&p->rxaio);
	nni_aio_stop(&p->txaio);
	nni_aio_stop(&p->negoaio);
	nng_stream_stop(p->conn);
	nni_mtx_lock(&ep->mtx);
	nni_list_node_remove(&p->node);
	nni_mtx_unlock(&ep->mtx);
}